

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

void __thiscall
asio::detail::object_pool<asio::detail::epoll_reactor::descriptor_state>::~object_pool
          (object_pool<asio::detail::epoll_reactor::descriptor_state> *this)

{
  object_pool<asio::detail::epoll_reactor::descriptor_state> *this_local;
  
  destroy_list(this,this->live_list_);
  destroy_list(this,this->free_list_);
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

~object_pool()
  {
    destroy_list(live_list_);
    destroy_list(free_list_);
  }